

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O3

bool Gudhi::persistence_matrix::operator==
               (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>
                *c1,Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>
                    *c2)

{
  stored_size_type sVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  long lVar4;
  bool bVar5;
  
  bVar5 = true;
  if (c1 != c2) {
    sVar1 = (c1->column_).
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
            .super_type.m_holder.m_size;
    if (sVar1 == (c2->column_).
                 super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
                 .super_type.m_holder.m_size) {
      if (sVar1 != 0) {
        ppEVar2 = (c1->column_).
                  super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
                  .super_type.m_holder.m_start;
        ppEVar3 = (c2->column_).
                  super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
                  .super_type.m_holder.m_start;
        lVar4 = sVar1 * 8;
        do {
          lVar4 = lVar4 + -8;
          if ((ppEVar2 == (pointer)0x0) || (ppEVar3 == (pointer)0x0)) {
            __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                          "reference boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, false, false, false>>> **, true>::operator*() const [Pointer = Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, false, false, false>>> **, IsConst = true]"
                         );
          }
          bVar5 = (*ppEVar2)->rowIndex_ == (*ppEVar3)->rowIndex_;
          if (!bVar5) {
            return bVar5;
          }
          ppEVar2 = ppEVar2 + 1;
          ppEVar3 = ppEVar3 + 1;
        } while (lVar4 != 0);
      }
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool operator==(const Naive_vector_column& c1, const Naive_vector_column& c2) {
    if (&c1 == &c2) return true;
    if (c1.column_.size() != c2.column_.size()) return false;

    auto it1 = c1.column_.begin();
    auto it2 = c2.column_.begin();
    while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        if ((*it1)->get_row_index() != (*it2)->get_row_index()) return false;
      } else {
        if ((*it1)->get_row_index() != (*it2)->get_row_index() || (*it1)->get_element() != (*it2)->get_element())
          return false;
      }
      ++it1;
      ++it2;
    }
    return true;
  }